

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

void __thiscall BackwardPass::ProcessNewScObject(BackwardPass *this,Instr *instr)

{
  BasicBlock *block;
  Func *this_00;
  BVSparse<Memory::JitArenaAllocator> *propOps;
  code *pcVar1;
  undefined8 this_01;
  bool bVar2;
  BOOLEAN BVar3;
  BailOutKind BVar4;
  undefined4 *puVar5;
  RegOpnd *pRVar6;
  Loop *objSym;
  StackSym *this_02;
  ProfiledInstr *pPVar7;
  AddPropertyCacheBucket *data;
  ObjTypeGuardBucket *pOVar8;
  BackwardPass *this_03;
  JITTypeHolderBase<void> local_70;
  JITTypeHolderBase<void> local_68;
  JITTypeHolderBase<void> local_60;
  undefined1 local_58 [24];
  JITTypeHolderBase<void> local_40;
  Loop *local_38;
  
  if ((((this->tag == DeadStorePhase) && (this->isCollectionPass == false)) &&
      ((instr->m_opcode == NewScObjectNoCtor || (instr->m_opcode == NewScObject)))) &&
     ((instr->field_0x38 & 0x10) != 0)) {
    BVar4 = IR::Instr::GetBailOutKindNoBits(instr);
    if (BVar4 != BailOutFailedCtorGuardCheck) {
      return;
    }
    if (instr->m_kind != InstrKindProfiled) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x131d,"(instr->IsProfiledInstr())","instr->IsProfiledInstr()");
      if (!bVar2) goto LAB_003cc093;
      *puVar5 = 0;
    }
    bVar2 = IR::Opnd::IsRegOpnd(instr->m_dst);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x131e,"(instr->GetDst()->IsRegOpnd())","instr->GetDst()->IsRegOpnd()");
      if (!bVar2) goto LAB_003cc093;
      *puVar5 = 0;
    }
    block = this->currentBlock;
    pRVar6 = IR::Opnd::AsRegOpnd(instr->m_dst);
    objSym = (Loop *)IR::Opnd::GetStackSym(&pRVar6->super_Opnd);
    BVar3 = BVSparse<Memory::JitArenaAllocator>::Test
                      (block->upwardExposedUses,*(BVIndex *)&objSym->topFunc);
    if (BVar3 == '\0') {
      IR::Instr::ClearBailOutInfo(instr);
      if (this->preOpBailOutInstrToProcess == instr) {
        this->preOpBailOutInstrToProcess = (Instr *)0x0;
      }
      if (block->stackSymToGuardedProperties ==
          (HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *)0x0) {
        return;
      }
      pOVar8 = HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator>::Get
                         (block->stackSymToGuardedProperties,*(SymID *)&objSym->topFunc);
      if (pOVar8 == (ObjTypeGuardBucket *)0x0) {
        return;
      }
      bVar2 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(pOVar8->guardedPropertyOps);
      if (bVar2) {
        return;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x1369,"(bucket == nullptr || bucket->GetGuardedPropertyOps()->IsEmpty())"
                         ,"bucket == nullptr || bucket->GetGuardedPropertyOps()->IsEmpty()");
      if (bVar2) {
        *puVar5 = 0;
        return;
      }
LAB_003cc093:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    pRVar6 = IR::Opnd::AsRegOpnd(instr->m_dst);
    this_02 = IR::Opnd::GetStackSym(&pRVar6->super_Opnd);
    bVar2 = StackSym::HasObjectTypeSym(this_02);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x1327,"(instr->GetDst()->AsRegOpnd()->GetStackSym()->HasObjectTypeSym())"
                         ,"instr->GetDst()->AsRegOpnd()->GetStackSym()->HasObjectTypeSym()");
      if (!bVar2) goto LAB_003cc093;
      *puVar5 = 0;
    }
    this_00 = instr->m_func;
    pPVar7 = IR::Instr::AsProfiledInstr(instr);
    local_58._16_8_ = Func::GetConstructorCache(this_00,(pPVar7->u).field_3.fldInfoData.f1);
    if ((block->stackSymToFinalType !=
         (HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *)0x0) &&
       (data = HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator>::Get
                         (block->stackSymToFinalType,*(SymID *)&objSym->topFunc),
       data != (AddPropertyCacheBucket *)0x0)) {
      local_40.t = (data->initialType).t;
      local_58._8_8_ = (GlobOpt *)0x0;
      bVar2 = JITTypeHolderBase<void>::operator!=(&local_40,(nullptr_t *)(local_58 + 8));
      if (bVar2) {
        local_70.t = (data->finalType).t;
        local_68.t = (data->initialType).t;
        bVar2 = JITTypeHolderBase<void>::operator!=(&local_70,&local_68);
        if (bVar2) {
          local_40.t = (data->initialType).t;
          local_58._8_8_ =
               JITTimeConstructorCache::GetType((JITTimeConstructorCache *)local_58._16_8_);
          bVar2 = JITTypeHolderBase<void>::operator==
                            (&local_40,(JITTypeHolderBase<void> *)(local_58 + 8));
          if (!bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            local_38 = (Loop *)__tls_get_addr(&PTR_013e5f18);
            local_38->implicitCallFlags = ImplicitCall_None;
            local_38->loopFlags = (LoopFlags)0x0;
            *(undefined2 *)&local_38->field_0x2 = 0;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0x1334,"(pBucket->GetInitialType() == ctorCache->GetType())",
                               "pBucket->GetInitialType() == ctorCache->GetType()");
            if (!bVar2) goto LAB_003cc093;
            local_38->implicitCallFlags = ImplicitCall_HasNoInfo;
            local_38->loopFlags = (LoopFlags)0x0;
            *(undefined2 *)&local_38->field_0x2 = 0;
          }
          if (this->currentPrePassLoop == (Loop *)0x0) {
            InsertTypeTransition
                      (this,instr->m_next,(StackSym *)objSym,data,block->upwardExposedUses);
          }
          (data->deadStoreUnavailableInitialType).t = (data->initialType).t;
          local_40.t = (Type)0x0;
          bVar2 = JITTypeHolderBase<void>::operator==
                            (&data->deadStoreUnavailableFinalType,&local_40.t);
          if (bVar2) {
            (data->deadStoreUnavailableFinalType).t = (data->finalType).t;
          }
          JITTypeHolderBase<void>::JITTypeHolderBase(&local_60,(JITType *)0x0);
          (data->initialType).t = local_60.t;
          this_03 = (BackwardPass *)local_58;
          JITTypeHolderBase<void>::JITTypeHolderBase
                    ((JITTypeHolderBase<void> *)this_03,(JITType *)0x0);
          (data->finalType).t = (Type)local_58._0_8_;
          ClearTypeIDWithFinalType(this_03,*(SymID *)&objSym->topFunc,block);
        }
      }
    }
    if (((block->stackSymToGuardedProperties !=
          (HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *)0x0) &&
        (pOVar8 = HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator>::Get
                            (block->stackSymToGuardedProperties,*(SymID *)&objSym->topFunc),
        this_01 = local_58._16_8_, pOVar8 != (ObjTypeGuardBucket *)0x0)) &&
       (propOps = pOVar8->guardedPropertyOps, propOps != (BVSparse<Memory::JitArenaAllocator> *)0x0)
       ) {
      local_38 = objSym;
      JITTimeConstructorCache::EnsureGuardedPropOps
                ((JITTimeConstructorCache *)local_58._16_8_,this->func->m_alloc);
      JITTimeConstructorCache::AddGuardedPropOps((JITTimeConstructorCache *)this_01,propOps);
      pOVar8->guardedPropertyOps = (BVSparse<Memory::JitArenaAllocator> *)0x0;
      Memory::
      DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                (this->tempAlloc,propOps);
      HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator>::Clear
                (block->stackSymToGuardedProperties,*(SymID *)&local_38->topFunc);
    }
  }
  return;
}

Assistant:

void
BackwardPass::ProcessNewScObject(IR::Instr* instr)
{
    if (this->tag != Js::DeadStorePhase || IsCollectionPass())
    {
        return;
    }

    if (!instr->IsNewScObjectInstr())
    {
        return;
    }

    // The instruction could have a lazy bailout associated with it, which might get cleared
    // later, so we make sure that we only process instructions with the right bailout kind.
    if (instr->HasBailOutInfo() && instr->GetBailOutKindNoBits() == IR::BailOutFailedCtorGuardCheck)
    {
        Assert(instr->IsProfiledInstr());
        Assert(instr->GetDst()->IsRegOpnd());

        BasicBlock * block = this->currentBlock;
        StackSym* objSym = instr->GetDst()->AsRegOpnd()->GetStackSym();

        if (block->upwardExposedUses->Test(objSym->m_id))
        {
            // If the object created here is used downstream, let's capture any property operations we must protect.

            Assert(instr->GetDst()->AsRegOpnd()->GetStackSym()->HasObjectTypeSym());

            JITTimeConstructorCache* ctorCache = instr->m_func->GetConstructorCache(static_cast<Js::ProfileId>(instr->AsProfiledInstr()->u.profileId));

            if (block->stackSymToFinalType != nullptr)
            {
                // NewScObject is the origin of the object pointer. If we have a final type in hand, do the
                // transition here.
                AddPropertyCacheBucket *pBucket = block->stackSymToFinalType->Get(objSym->m_id);
                if (pBucket &&
                    pBucket->GetInitialType() != nullptr &&
                    pBucket->GetFinalType() != pBucket->GetInitialType())
                {
                    Assert(pBucket->GetInitialType() == ctorCache->GetType());
                    if (!this->IsPrePass())
                    {
                        this->InsertTypeTransition(instr->m_next, objSym, pBucket, block->upwardExposedUses);
                    }
#if DBG
                    pBucket->deadStoreUnavailableInitialType = pBucket->GetInitialType();
                    if (pBucket->deadStoreUnavailableFinalType == nullptr)
                    {
                        pBucket->deadStoreUnavailableFinalType = pBucket->GetFinalType();
                    }
                    pBucket->SetInitialType(nullptr);
                    pBucket->SetFinalType(nullptr);
#else
                    block->stackSymToFinalType->Clear(objSym->m_id);
#endif
                    this->ClearTypeIDWithFinalType(objSym->m_id, block);
                }
            }

            if (block->stackSymToGuardedProperties != nullptr)
            {
                ObjTypeGuardBucket* bucket = block->stackSymToGuardedProperties->Get(objSym->m_id);
                if (bucket != nullptr)
                {
                    BVSparse<JitArenaAllocator>* guardedPropertyOps = bucket->GetGuardedPropertyOps();
                    if (guardedPropertyOps != nullptr)
                    {
                        ctorCache->EnsureGuardedPropOps(this->func->m_alloc);
                        ctorCache->AddGuardedPropOps(guardedPropertyOps);

                        bucket->SetGuardedPropertyOps(nullptr);
                        JitAdelete(this->tempAlloc, guardedPropertyOps);
                        block->stackSymToGuardedProperties->Clear(objSym->m_id);
                    }
                }
            }
        }
        else
        {
            // If the object is not used downstream, let's remove the bailout and let the lowerer emit a fast path along with
            // the fallback on helper, if the ctor cache ever became invalid.
            instr->ClearBailOutInfo();
            if (preOpBailOutInstrToProcess == instr)
            {
                preOpBailOutInstrToProcess = nullptr;
            }

#if DBG
            // We're creating a brand new object here, so no type check upstream could protect any properties of this
            // object. Let's make sure we don't have any left to protect.
            ObjTypeGuardBucket* bucket = block->stackSymToGuardedProperties != nullptr ?
                block->stackSymToGuardedProperties->Get(objSym->m_id) : nullptr;
            Assert(bucket == nullptr || bucket->GetGuardedPropertyOps()->IsEmpty());
#endif
        }
    }
}